

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  StringOutputStream *pSVar3;
  mapped_type *ppbVar4;
  long lVar5;
  ostream *poVar6;
  mapped_type pbVar7;
  long lVar8;
  ulong uVar9;
  LogMessage *other;
  size_type sVar10;
  pointer pcVar11;
  ulong uVar12;
  size_type sVar13;
  int iVar14;
  pointer pcVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  SubstituteArg *in_stack_fffffffffffffda8;
  MemoryOutputStream *pMVar20;
  string indent_;
  string magic_string;
  pointer local_1e8;
  undefined4 local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_0028dd38;
  pSVar3 = (this->inner_).ptr_;
  if (pSVar3 != (StringOutputStream *)0x0) {
    (*(pSVar3->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[1])();
    (this->inner_).ptr_ = (StringOutputStream *)0x0;
  }
  ppbVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::operator[](&this->directory_->files_,&this->filename_);
  if ((this->insertion_point_)._M_string_length == 0) {
    if (*ppbVar4 == (mapped_type)0x0) {
      pbVar7 = (mapped_type)operator_new(0x20);
      (pbVar7->_M_dataplus)._M_p = (pointer)&pbVar7->field_2;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      *ppbVar4 = pbVar7;
      std::__cxx11::string::swap((string *)pbVar7);
      goto LAB_0017f377;
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,": Tried to write the same file twice.",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  else {
    psVar1 = &this->data_;
    sVar10 = (this->data_)._M_string_length;
    if ((sVar10 != 0) && ((psVar1->_M_dataplus)._M_p[sVar10 - 1] != '\n')) {
      std::__cxx11::string::push_back((char)psVar1);
    }
    pbVar7 = *ppbVar4;
    if (pbVar7 != (mapped_type)0x0) {
      local_1e8 = (this->insertion_point_)._M_dataplus._M_p;
      local_1e0 = (undefined4)(this->insertion_point_)._M_string_length;
      indent_._M_dataplus._M_p = (pointer)0x0;
      indent_._M_string_length._0_4_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&magic_string,(strings *)"@@protoc_insertion_point($0)",(char *)&local_1e8,
                 (SubstituteArg *)&indent_,&local_1b0,&local_60,&local_90,&local_c0,&local_f0,
                 &local_120,&local_150,&local_180,in_stack_fffffffffffffda8);
      lVar5 = std::__cxx11::string::find((char *)pbVar7,(ulong)magic_string._M_dataplus._M_p,0);
      if (lVar5 == -1) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                            (this->filename_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": insertion point \"",0x13);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(this->insertion_point_)._M_dataplus._M_p,
                            (this->insertion_point_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" not found.",0xc);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        this->directory_->had_error_ = true;
      }
      else {
        lVar5 = std::__cxx11::string::rfind((char)pbVar7,10);
        uVar16 = lVar5 + 1;
        lVar5 = std::__cxx11::string::find_first_not_of((char *)pbVar7,0x22c411,uVar16);
        std::__cxx11::string::string((string *)&indent_,(string *)pbVar7,uVar16,lVar5 - uVar16);
        if (CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length) == 0) {
          std::__cxx11::string::replace
                    ((ulong)pbVar7,uVar16,(char *)0x0,(ulong)(this->data_)._M_dataplus._M_p);
        }
        else {
          sVar10 = (this->data_)._M_string_length;
          uVar19 = 0;
          if (sVar10 != 0) {
            sVar13 = 0;
            do {
              iVar14 = 0;
              if ((psVar1->_M_dataplus)._M_p[sVar13] == '\n') {
                iVar14 = (int)indent_._M_string_length;
              }
              uVar18 = (int)uVar19 + iVar14;
              uVar19 = (ulong)uVar18;
              sVar13 = sVar13 + 1;
            } while (sVar10 != sVar13);
            uVar19 = (ulong)(int)uVar18;
          }
          std::__cxx11::string::insert((ulong)pbVar7,uVar16,(char)sVar10 + (char)uVar19);
          sVar10 = pbVar7->_M_string_length;
          if (sVar10 == 0) {
            pcVar15 = (pointer)0x0;
          }
          else {
            pcVar15 = (pbVar7->_M_dataplus)._M_p;
          }
          pcVar15 = pcVar15 + uVar16;
          if ((this->data_)._M_string_length == 0) {
            uVar9 = 0;
          }
          else {
            uVar12 = 0;
            pMVar20 = this;
            do {
              memcpy(pcVar15,indent_._M_dataplus._M_p,
                     CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length));
              lVar5 = CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length);
              lVar8 = std::__cxx11::string::find((char)psVar1,10);
              uVar17 = lVar8 + 1;
              memcpy(pcVar15 + lVar5,(this->data_)._M_dataplus._M_p + uVar12,uVar17 - uVar12);
              pcVar15 = pcVar15 + lVar5 + (uVar17 - uVar12);
              uVar9 = (this->data_)._M_string_length;
              uVar12 = uVar17;
            } while (uVar17 < uVar9);
            sVar10 = pbVar7->_M_string_length;
            this = pMVar20;
          }
          if (sVar10 == 0) {
            pcVar11 = (pointer)0x0;
          }
          else {
            pcVar11 = (pbVar7->_M_dataplus)._M_p;
          }
          if (pcVar15 != pcVar11 + uVar19 + uVar9 + uVar16) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&local_1e8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x22f);
            other = internal::LogMessage::operator<<
                              ((LogMessage *)&local_1e8,
                               "CHECK failed: (target_ptr) == (string_as_array(target) + pos + data_.size() + indent_size): "
                              );
            internal::LogFinisher::operator=((LogFinisher *)&local_1b0,other);
            internal::LogMessage::~LogMessage((LogMessage *)&local_1e8);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)indent_._M_dataplus._M_p != &indent_.field_2) {
          operator_delete(indent_._M_dataplus._M_p,indent_.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)magic_string._M_dataplus._M_p != &magic_string.field_2) {
        operator_delete(magic_string._M_dataplus._M_p,magic_string.field_2._M_allocated_capacity + 1
                       );
      }
      goto LAB_0017f377;
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,": Tried to insert into file that doesn\'t exist.",0x2f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  this->directory_->had_error_ = true;
LAB_0017f377:
  pSVar3 = (this->inner_).ptr_;
  if (pSVar3 != (StringOutputStream *)0x0) {
    (*(pSVar3->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[1])();
  }
  pcVar15 = (this->data_)._M_dataplus._M_p;
  paVar2 = &(this->data_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar15 != paVar2) {
    operator_delete(pcVar15,paVar2->_M_allocated_capacity + 1);
  }
  pcVar15 = (this->insertion_point_)._M_dataplus._M_p;
  paVar2 = &(this->insertion_point_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar15 != paVar2) {
    operator_delete(pcVar15,paVar2->_M_allocated_capacity + 1);
  }
  pcVar15 = (this->filename_)._M_dataplus._M_p;
  paVar2 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar15 != paVar2) {
    operator_delete(pcVar15,paVar2->_M_allocated_capacity + 1);
  }
  io::ZeroCopyOutputStream::~ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  string** map_slot = &directory_->files_[filename_];

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (*map_slot != NULL) {
      cerr << filename_ << ": Tried to write the same file twice." << endl;
      directory_->had_error_ = true;
      return;
    }

    *map_slot = new string;
    (*map_slot)->swap(data_);
  } else {
    // This was an OpenForInsert().

    // If the data doens't end with a clean line break, add one.
    if (!data_.empty() && data_[data_.size() - 1] != '\n') {
      data_.push_back('\n');
    }

    // Find the file we are going to insert into.
    if (*map_slot == NULL) {
      cerr << filename_ << ": Tried to insert into file that doesn't exist."
           << endl;
      directory_->had_error_ = true;
      return;
    }
    string* target = *map_slot;

    // Find the insertion point.
    string magic_string = strings::Substitute(
        "@@protoc_insertion_point($0)", insertion_point_);
    string::size_type pos = target->find(magic_string);

    if (pos == string::npos) {
      cerr << filename_ << ": insertion point \"" << insertion_point_
           << "\" not found." << endl;
      directory_->had_error_ = true;
      return;
    }

    // Seek backwards to the beginning of the line, which is where we will
    // insert the data.  Note that this has the effect of pushing the insertion
    // point down, so the data is inserted before it.  This is intentional
    // because it means that multiple insertions at the same point will end
    // up in the expected order in the final output.
    pos = target->find_last_of('\n', pos);
    if (pos == string::npos) {
      // Insertion point is on the first line.
      pos = 0;
    } else {
      // Advance to character after '\n'.
      ++pos;
    }

    // Extract indent.
    string indent_(*target, pos, target->find_first_not_of(" \t", pos) - pos);

    if (indent_.empty()) {
      // No indent.  This makes things easier.
      target->insert(pos, data_);
    } else {
      // Calculate how much space we need.
      int indent_size = 0;
      for (int i = 0; i < data_.size(); i++) {
        if (data_[i] == '\n') indent_size += indent_.size();
      }

      // Make a hole for it.
      target->insert(pos, data_.size() + indent_size, '\0');

      // Now copy in the data.
      string::size_type data_pos = 0;
      char* target_ptr = string_as_array(target) + pos;
      while (data_pos < data_.size()) {
        // Copy indent.
        memcpy(target_ptr, indent_.data(), indent_.size());
        target_ptr += indent_.size();

        // Copy line from data_.
        // We already guaranteed that data_ ends with a newline (above), so this
        // search can't fail.
        string::size_type line_length =
            data_.find_first_of('\n', data_pos) + 1 - data_pos;
        memcpy(target_ptr, data_.data() + data_pos, line_length);
        target_ptr += line_length;
        data_pos += line_length;
      }

      GOOGLE_CHECK_EQ(target_ptr,
          string_as_array(target) + pos + data_.size() + indent_size);
    }
  }
}